

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O1

void __thiscall
r_exec::_GMonitor::_GMonitor
          (_GMonitor *this,PMDLController *controller,BindingMap *bindings,uint64_t deadline,
          uint64_t sim_thz,Fact *goal,Fact *f_imdl)

{
  SolutionList *pSVar1;
  atomic_int_fast64_t *paVar2;
  ulong uVar3;
  Goal *pGVar4;
  _Fact *p_Var5;
  
  Monitor::Monitor(&this->super_Monitor,&controller->super_MDLController,bindings,goal);
  (this->super_Monitor).super__Object._vptr__Object = (_func_int **)&PTR___GMonitor_001bf8a8;
  this->deadline = deadline;
  this->sim_thz = sim_thz;
  (this->f_imdl).object = (_Object *)f_imdl;
  if (f_imdl != (Fact *)0x0) {
    LOCK();
    paVar2 = &(f_imdl->super__Fact).super_LObject.super_Object<r_code::LObject,_r_exec::LObject>.
              super_LObject.super_Code.super__Object.refCount;
    (paVar2->super___atomic_base<long>)._M_i = (paVar2->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  (this->sim_successes).mandatory_solutions.
  super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->sim_successes;
  (this->sim_successes).mandatory_solutions.
  super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->sim_successes;
  (this->sim_successes).mandatory_solutions.
  super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
  ._M_impl._M_node._M_size = 0;
  pSVar1 = &(this->sim_successes).optional_solutions;
  (this->sim_successes).optional_solutions.
  super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pSVar1;
  (this->sim_successes).optional_solutions.
  super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pSVar1;
  (this->sim_successes).optional_solutions.
  super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->sim_failures).mandatory_solutions.
  super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->sim_failures;
  (this->sim_failures).mandatory_solutions.
  super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->sim_failures;
  (this->sim_failures).mandatory_solutions.
  super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
  ._M_impl._M_node._M_size = 0;
  pSVar1 = &(this->sim_failures).optional_solutions;
  (this->sim_failures).optional_solutions.
  super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pSVar1;
  (this->sim_failures).optional_solutions.
  super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pSVar1;
  (this->sim_failures).optional_solutions.
  super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
  ._M_impl._M_node._M_size = 0;
  uVar3 = (*Now)();
  this->simulating = (ulong)(uVar3 < sim_thz);
  pGVar4 = _Fact::get_goal(&goal->super__Fact);
  this->sim_mode =
       *(SimMode *)((long)&(pGVar4->sim).object[1].refCount.super___atomic_base<long>._M_i + 4);
  pGVar4 = _Fact::get_goal((_Fact *)(this->super_Monitor).target.object);
  p_Var5 = Goal::get_target(pGVar4);
  this->goal_target = p_Var5;
  return;
}

Assistant:

_GMonitor::_GMonitor(PMDLController *controller,
                     BindingMap *bindings,
                     uint64_t deadline,
                     uint64_t sim_thz,
                     Fact *goal,
                     Fact *f_imdl): Monitor(controller,
                                 bindings,
                                 goal),
    deadline(deadline),
    sim_thz(sim_thz),
    f_imdl(f_imdl)   // goal is f0->g->f1->object.
{
    simulating = (sim_thz > Now());
    sim_mode = goal->get_goal()->sim->mode;
    goal_target = target->get_goal()->get_target(); // f1.
}